

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O1

bool __thiscall
glslang::HlslGrammar::acceptFunctionCall
          (HlslGrammar *this,TSourceLoc *loc,TString *name,TIntermTyped **node,
          TIntermTyped *baseObject)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  TPoolAllocator *pTVar4;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  TFunction *this_01;
  TIntermTyped *pTVar6;
  TIntermTyped *arguments;
  TType local_c8;
  
  if (baseObject != (TIntermTyped *)0x0) {
    bVar1 = HlslParseContext::isBuiltInMethod(this->parseContext,loc,baseObject,name);
    if (bVar1) {
      pTVar4 = GetThreadPoolAllocator();
      this_00 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                TPoolAllocator::allocate(pTVar4,0x28);
      pTVar4 = GetThreadPoolAllocator();
      (this_00->_M_dataplus).super_allocator_type.allocator = pTVar4;
      (this_00->_M_dataplus)._M_p = (pointer)&this_00->field_2;
      *(undefined4 *)&this_00->field_2 = 0x49425f5f;
      *(undefined2 *)((long)&this_00->field_2 + 4) = 0x5f;
      this_00->_M_string_length = 5;
    }
    else {
      iVar3 = (*(baseObject->super_TIntermNode)._vptr_TIntermNode[0x1e])(baseObject);
      cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x128))
                        ((long *)CONCAT44(extraout_var,iVar3));
      if (cVar2 == '\0') {
        (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
          [0x2d])(this->parseContext,&(this->super_HlslTokenStream).token,"Expected","structure","")
        ;
        return false;
      }
      pTVar4 = GetThreadPoolAllocator();
      this_00 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                TPoolAllocator::allocate(pTVar4,0x28);
      pTVar4 = GetThreadPoolAllocator();
      (this_00->_M_dataplus).super_allocator_type.allocator = pTVar4;
      (this_00->_M_dataplus)._M_p = (pointer)&this_00->field_2;
      this_00->_M_string_length = 0;
      (this_00->field_2)._M_local_buf[0] = '\0';
      iVar3 = (*(baseObject->super_TIntermNode)._vptr_TIntermNode[0x1e])(baseObject);
      lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x28))
                        ((long *)CONCAT44(extraout_var_00,iVar3));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      _M_append(this_00,*(char **)(lVar5 + 8),*(size_type *)(lVar5 + 0x10));
      HlslParseContext::addScopeMangler(this->parseContext,this_00);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_append(this_00,(name->_M_dataplus)._M_p,name->_M_string_length);
    name = this_00;
  }
  pTVar4 = GetThreadPoolAllocator();
  this_01 = (TFunction *)TPoolAllocator::allocate(pTVar4,0x160);
  TType::TType(&local_c8,EbtVoid,EvqTemporary,1,0,0,false);
  TFunction::TFunction(this_01,name,&local_c8,EOpNull);
  local_c8._vptr_TType = (_func_int **)0x0;
  if (baseObject != (TIntermTyped *)0x0) {
    HlslParseContext::handleFunctionArgument
              (this->parseContext,this_01,(TIntermTyped **)&local_c8,baseObject);
  }
  bVar1 = acceptArguments(this,this_01,(TIntermTyped **)&local_c8);
  if (bVar1) {
    pTVar6 = HlslParseContext::handleFunctionCall
                       (this->parseContext,loc,this_01,(TIntermTyped *)local_c8._vptr_TType);
    *node = pTVar6;
    bVar1 = pTVar6 != (TIntermTyped *)0x0;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool HlslGrammar::acceptFunctionCall(const TSourceLoc& loc, TString& name, TIntermTyped*& node, TIntermTyped* baseObject)
{
    // name
    TString* functionName = nullptr;
    if (baseObject == nullptr) {
        functionName = &name;
    } else if (parseContext.isBuiltInMethod(loc, baseObject, name)) {
        // Built-in methods are not in the symbol table as methods, but as global functions
        // taking an explicit 'this' as the first argument.
        functionName = NewPoolTString(BUILTIN_PREFIX);
        functionName->append(name);
    } else {
        if (! baseObject->getType().isStruct()) {
            expected("structure");
            return false;
        }
        functionName = NewPoolTString("");
        functionName->append(baseObject->getType().getTypeName());
        parseContext.addScopeMangler(*functionName);
        functionName->append(name);
    }

    // function
    TFunction* function = new TFunction(functionName, TType(EbtVoid));

    // arguments
    TIntermTyped* arguments = nullptr;
    if (baseObject != nullptr) {
        // Non-static member functions have an implicit first argument of the base object.
        parseContext.handleFunctionArgument(function, arguments, baseObject);
    }
    if (! acceptArguments(function, arguments))
        return false;

    // call
    node = parseContext.handleFunctionCall(loc, function, arguments);

    return node != nullptr;
}